

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

monst * get_mtraits(obj *obj,boolean copyof)

{
  byte bVar1;
  short sVar2;
  monst *pmStack_28;
  int lth;
  monst *mnew;
  monst *mtmp;
  boolean copyof_local;
  obj *obj_local;
  
  mnew = (monst *)0x0;
  pmStack_28 = (monst *)0x0;
  if ((obj->oxlth != 0) && ((*(uint *)&obj->field_0x4a >> 0x15 & 3) == 1)) {
    mnew = (monst *)obj->oextra;
  }
  if (mnew != (monst *)0x0) {
    if (copyof == '\0') {
      pmStack_28 = mnew;
    }
    else {
      sVar2 = mnew->mxlth;
      bVar1 = mnew->mnamelth;
      pmStack_28 = newmonst((uint)mnew->mxtyp,(uint)mnew->mnamelth);
      memcpy(pmStack_28,mnew,(long)(int)((int)sVar2 + (uint)bVar1 + 0x78));
    }
  }
  return pmStack_28;
}

Assistant:

struct monst *get_mtraits(struct obj *obj, boolean copyof)
{
	struct monst *mtmp = NULL;
	struct monst *mnew = NULL;

	if (obj->oxlth && obj->oattached == OATTACHED_MONST)
		mtmp = (struct monst *)obj->oextra;
	if (mtmp) {
	    if (copyof) {
		int lth = mtmp->mxlth + mtmp->mnamelth + sizeof(struct monst);
		mnew = newmonst(mtmp->mxtyp, mtmp->mnamelth);
		memcpy(mnew, mtmp, lth);
	    } else {
	      /* Never insert this returned pointer into mon chains! */
	    	mnew = mtmp;
	    }
	}
	return mnew;
}